

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

int Vta_ManComputeDepthIncrease(Vta_Obj_t **pp1,Vta_Obj_t **pp2)

{
  int iVar1;
  int Diff;
  Vta_Obj_t **pp2_local;
  Vta_Obj_t **pp1_local;
  
  iVar1 = (*(uint *)&(*pp1)->field_0xc & 0xfffffff) - (*(uint *)&(*pp2)->field_0xc & 0xfffffff);
  if (iVar1 < 0) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar1 < 1) {
    iVar1 = (int)((long)*pp1 - (long)*pp2 >> 4);
    if (iVar1 < 0) {
      pp1_local._4_4_ = -1;
    }
    else if (iVar1 < 1) {
      pp1_local._4_4_ = 0;
    }
    else {
      pp1_local._4_4_ = 1;
    }
  }
  else {
    pp1_local._4_4_ = 1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Vta_ManComputeDepthIncrease( Vta_Obj_t ** pp1, Vta_Obj_t ** pp2 )
{
    int Diff = (*pp1)->Prio - (*pp2)->Prio;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = (*pp1) - (*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}